

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void __thiscall
leveldb::InternalFilterPolicy::CreateFilter
          (InternalFilterPolicy *this,Slice *keys,int n,string *dst)

{
  Slice SVar1;
  char *local_48;
  size_t local_40;
  int local_34;
  int i;
  Slice *mkey;
  string *dst_local;
  int n_local;
  Slice *keys_local;
  InternalFilterPolicy *this_local;
  
  for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
    SVar1 = ExtractUserKey(keys + local_34);
    local_48 = SVar1.data_;
    keys[local_34].data_ = local_48;
    local_40 = SVar1.size_;
    keys[local_34].size_ = local_40;
  }
  (*this->user_policy_->_vptr_FilterPolicy[3])(this->user_policy_,keys,(ulong)(uint)n,dst);
  return;
}

Assistant:

void InternalFilterPolicy::CreateFilter(const Slice* keys, int n,
                                        std::string* dst) const {
  // We rely on the fact that the code in table.cc does not mind us
  // adjusting keys[].
  Slice* mkey = const_cast<Slice*>(keys);
  for (int i = 0; i < n; i++) {
    mkey[i] = ExtractUserKey(keys[i]);
    // TODO(sanjay): Suppress dups?
  }
  user_policy_->CreateFilter(keys, n, dst);
}